

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int32_t nghttp2_submit_push_promise
                  (nghttp2_session *session,uint8_t flags,int32_t stream_id,nghttp2_nv *nva,
                  size_t nvlen,void *promised_stream_user_data)

{
  int iVar1;
  uint32_t uVar2;
  nghttp2_nv **nva_00;
  int in_EDX;
  nghttp2_session *in_RDI;
  nghttp2_session *in_R8;
  nghttp2_outbound_item *in_R9;
  nghttp2_mem *mem;
  int rv;
  int32_t promised_stream_id;
  uint8_t flags_copy;
  nghttp2_nv *nva_copy;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  nghttp2_mem *in_stack_ffffffffffffff98;
  nghttp2_push_promise *frame_00;
  int32_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  size_t in_stack_ffffffffffffffb8;
  uint32_t local_4;
  
  frame_00 = (nghttp2_push_promise *)&in_RDI->mem;
  if ((in_EDX < 1) || (iVar1 = nghttp2_session_is_my_stream_id(in_RDI,in_EDX), iVar1 != 0)) {
    local_4 = 0xfffffe0b;
  }
  else if (in_RDI->server == '\0') {
    local_4 = 0xfffffe07;
  }
  else if (in_RDI->next_stream_id < 0x80000000) {
    nva_00 = (nghttp2_nv **)
             nghttp2_mem_malloc((nghttp2_mem *)frame_00,(size_t)in_stack_ffffffffffffff98);
    if (nva_00 == (nghttp2_nv **)0x0) {
      local_4 = 0xfffffc7b;
    }
    else {
      nghttp2_outbound_item_init((nghttp2_outbound_item *)0x11ead6);
      nva_00[0xf] = (nghttp2_nv *)in_R9;
      uVar2 = nghttp2_nv_array_copy
                        (nva_00,(nghttp2_nv *)nva_00,in_stack_ffffffffffffffb8,
                         (nghttp2_mem *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      if ((int)uVar2 < 0) {
        nghttp2_mem_free((nghttp2_mem *)frame_00,in_stack_ffffffffffffff98);
        local_4 = uVar2;
      }
      else {
        local_4 = in_RDI->next_stream_id;
        in_RDI->next_stream_id = in_RDI->next_stream_id + 2;
        nghttp2_frame_push_promise_init
                  ((nghttp2_push_promise *)
                   CONCAT44(CONCAT13(4,(int3)in_stack_ffffffffffffffb4),local_4),
                   (uint8_t)(uVar2 >> 0x18),in_stack_ffffffffffffffa8,
                   (int32_t)((ulong)frame_00 >> 0x20),(nghttp2_nv *)in_stack_ffffffffffffff98,
                   0x11eb79);
        uVar2 = nghttp2_session_add_item(in_R8,in_R9);
        if (uVar2 != 0) {
          nghttp2_frame_push_promise_free(frame_00,in_stack_ffffffffffffff98);
          nghttp2_mem_free((nghttp2_mem *)frame_00,in_stack_ffffffffffffff98);
          local_4 = uVar2;
        }
      }
    }
  }
  else {
    local_4 = 0xfffffe03;
  }
  return local_4;
}

Assistant:

int32_t nghttp2_submit_push_promise(nghttp2_session *session, uint8_t flags,
                                    int32_t stream_id, const nghttp2_nv *nva,
                                    size_t nvlen,
                                    void *promised_stream_user_data) {
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_nv *nva_copy;
  uint8_t flags_copy;
  int32_t promised_stream_id;
  int rv;
  nghttp2_mem *mem;
  (void)flags;

  mem = &session->mem;

  if (stream_id <= 0 || nghttp2_session_is_my_stream_id(session, stream_id)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (!session->server) {
    return NGHTTP2_ERR_PROTO;
  }

  /* All 32bit signed stream IDs are spent. */
  if (session->next_stream_id > INT32_MAX) {
    return NGHTTP2_ERR_STREAM_ID_NOT_AVAILABLE;
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  item->aux_data.headers.stream_user_data = promised_stream_user_data;

  frame = &item->frame;

  rv = nghttp2_nv_array_copy(&nva_copy, nva, nvlen, mem);
  if (rv < 0) {
    nghttp2_mem_free(mem, item);
    return rv;
  }

  flags_copy = NGHTTP2_FLAG_END_HEADERS;

  promised_stream_id = (int32_t)session->next_stream_id;
  session->next_stream_id += 2;

  nghttp2_frame_push_promise_init(&frame->push_promise, flags_copy, stream_id,
                                  promised_stream_id, nva_copy, nvlen);

  rv = nghttp2_session_add_item(session, item);

  if (rv != 0) {
    nghttp2_frame_push_promise_free(&frame->push_promise, mem);
    nghttp2_mem_free(mem, item);

    return rv;
  }

  return promised_stream_id;
}